

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O2

Quaternion * __thiscall AML::Quaternion::operator*=(Quaternion *this,Quaternion *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar4 = (rhs->field_0).data[0];
  dVar1 = (rhs->field_0).data[1];
  dVar2 = (rhs->field_0).data[3];
  dVar5 = (this->field_0).data[0];
  dVar6 = (this->field_0).data[1];
  dVar7 = (this->field_0).data[2];
  dVar8 = (this->field_0).data[3];
  dVar3 = (rhs->field_0).data[2];
  (this->field_0).data[0] = -dVar2 * dVar8 + ((dVar4 * dVar5 + dVar6 * -dVar1) - dVar3 * dVar7);
  (this->field_0).data[1] = dVar2 * dVar7 + ((dVar4 * dVar6 + dVar5 * dVar1) - dVar3 * dVar8);
  (this->field_0).data[2] = dVar6 * -dVar2 + dVar3 * dVar5 + dVar4 * dVar7 + dVar1 * dVar8;
  (this->field_0).data[3] = dVar5 * dVar2 + dVar3 * dVar6 + dVar4 * dVar8 + -dVar1 * dVar7;
  return this;
}

Assistant:

Quaternion& Quaternion::operator*=(const Quaternion& rhs)
    {
        double q0_new = (rhs.q0 * q0) - (rhs.q1 * q1) - (rhs.q2 * q2) - (rhs.q3 * q3);
        double q1_new = (rhs.q0 * q1) + (rhs.q1 * q0) - (rhs.q2 * q3) + (rhs.q3 * q2);
        double q2_new = (rhs.q0 * q2) + (rhs.q1 * q3) + (rhs.q2 * q0) - (rhs.q3 * q1);
        double q3_new = (rhs.q0 * q3) - (rhs.q1 * q2) + (rhs.q2 * q1) + (rhs.q3 * q0);
        q0 = q0_new;
        q1 = q1_new;
        q2 = q2_new;
        q3 = q3_new;
        return *this;
    }